

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CodedInputStream::BackUpInputToCurrentPosition(CodedInputStream *this)

{
  int iVar1;
  uint uVar2;
  CodedInputStream *in_RDI;
  int backup_bytes;
  
  iVar1 = BufferSize(in_RDI);
  uVar2 = iVar1 + in_RDI->buffer_size_after_limit_ + in_RDI->overflow_bytes_;
  if (0 < (int)uVar2) {
    (*in_RDI->input_->_vptr_ZeroCopyInputStream[3])(in_RDI->input_,(ulong)uVar2);
    iVar1 = BufferSize(in_RDI);
    in_RDI->total_bytes_read_ =
         in_RDI->total_bytes_read_ - (iVar1 + in_RDI->buffer_size_after_limit_);
    in_RDI->buffer_end_ = in_RDI->buffer_;
    in_RDI->buffer_size_after_limit_ = 0;
    in_RDI->overflow_bytes_ = 0;
  }
  return;
}

Assistant:

void CodedInputStream::BackUpInputToCurrentPosition() {
  int backup_bytes = BufferSize() + buffer_size_after_limit_ + overflow_bytes_;
  if (backup_bytes > 0) {
    input_->BackUp(backup_bytes);

    // total_bytes_read_ doesn't include overflow_bytes_.
    total_bytes_read_ -= BufferSize() + buffer_size_after_limit_;
    buffer_end_ = buffer_;
    buffer_size_after_limit_ = 0;
    overflow_bytes_ = 0;
  }
}